

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O2

void __thiscall
Nova::Boundary_Uniform<float,_3>::Find_Ghost_Regions
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,Array<Nova::Range<int,_3>_> *regions,
          int number_of_ghost_cells)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  reference pvVar10;
  Range<int,_3> ghost;
  Range<int,_3> domain;
  
  Grid<float,_3>::Cell_Indices(&domain,grid,0);
  Range<int,_3>::Thickened(&ghost,&domain,number_of_ghost_cells);
  std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::resize(&regions->_data,6)
  ;
  iVar3 = ghost.min_corner._data._M_elems[0];
  uVar1 = CONCAT44(domain.min_corner._data._M_elems[2],domain.min_corner._data._M_elems[1]);
  uVar2 = CONCAT44(domain.max_corner._data._M_elems[2],domain.max_corner._data._M_elems[1]);
  pvVar10 = std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::at
                      (&regions->_data,0);
  iVar4 = ghost.max_corner._data._M_elems[0];
  (pvVar10->min_corner)._data._M_elems[0] = iVar3;
  *(undefined8 *)((pvVar10->min_corner)._data._M_elems + 1) = uVar1;
  (pvVar10->max_corner)._data._M_elems[0] = domain.min_corner._data._M_elems[0] + -1;
  *(undefined8 *)((pvVar10->max_corner)._data._M_elems + 1) = uVar2;
  uVar1 = CONCAT44(domain.min_corner._data._M_elems[2],domain.min_corner._data._M_elems[1]);
  uVar2 = CONCAT44(domain.max_corner._data._M_elems[2],domain.max_corner._data._M_elems[1]);
  pvVar10 = std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::at
                      (&regions->_data,1);
  iVar8 = domain.max_corner._data._M_elems[2];
  iVar6 = domain.min_corner._data._M_elems[2];
  iVar5 = ghost.max_corner._data._M_elems[0];
  (pvVar10->min_corner)._data._M_elems[0] = domain.max_corner._data._M_elems[0] + 1;
  *(undefined8 *)((pvVar10->min_corner)._data._M_elems + 1) = uVar1;
  (pvVar10->max_corner)._data._M_elems[0] = iVar4;
  *(undefined8 *)((pvVar10->max_corner)._data._M_elems + 1) = uVar2;
  uVar1 = CONCAT44(ghost.min_corner._data._M_elems[1],ghost.min_corner._data._M_elems[0]);
  pvVar10 = std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::at
                      (&regions->_data,2);
  iVar9 = domain.max_corner._data._M_elems[2];
  iVar7 = domain.min_corner._data._M_elems[2];
  iVar3 = ghost.min_corner._data._M_elems[0];
  *(undefined8 *)(pvVar10->min_corner)._data._M_elems = uVar1;
  (pvVar10->min_corner)._data._M_elems[2] = iVar6;
  (pvVar10->max_corner)._data._M_elems[0] = iVar5;
  (pvVar10->max_corner)._data._M_elems[1] = domain.min_corner._data._M_elems[1] + -1;
  (pvVar10->max_corner)._data._M_elems[2] = iVar8;
  uVar1 = CONCAT44(ghost.max_corner._data._M_elems[1],ghost.max_corner._data._M_elems[0]);
  pvVar10 = std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::at
                      (&regions->_data,3);
  iVar4 = ghost.max_corner._data._M_elems[1];
  (pvVar10->min_corner)._data._M_elems[0] = iVar3;
  (pvVar10->min_corner)._data._M_elems[1] = domain.max_corner._data._M_elems[1] + 1;
  (pvVar10->min_corner)._data._M_elems[2] = iVar7;
  *(undefined8 *)(pvVar10->max_corner)._data._M_elems = uVar1;
  (pvVar10->max_corner)._data._M_elems[2] = iVar9;
  uVar1 = CONCAT44(ghost.min_corner._data._M_elems[1],ghost.min_corner._data._M_elems[0]);
  uVar2 = CONCAT44(ghost.max_corner._data._M_elems[0],ghost.min_corner._data._M_elems[2]);
  pvVar10 = std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::at
                      (&regions->_data,4);
  *(undefined8 *)(pvVar10->min_corner)._data._M_elems = uVar1;
  *(undefined8 *)((pvVar10->min_corner)._data._M_elems + 2) = uVar2;
  (pvVar10->max_corner)._data._M_elems[1] = iVar4;
  (pvVar10->max_corner)._data._M_elems[2] = domain.min_corner._data._M_elems[2] + -1;
  pvVar10 = std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::at
                      (&regions->_data,5);
  *(ulong *)(pvVar10->min_corner)._data._M_elems =
       CONCAT44(ghost.min_corner._data._M_elems[1],ghost.min_corner._data._M_elems[0]);
  (pvVar10->min_corner)._data._M_elems[2] = domain.max_corner._data._M_elems[2] + 1;
  *(ulong *)(pvVar10->max_corner)._data._M_elems =
       CONCAT44(ghost.max_corner._data._M_elems[1],ghost.max_corner._data._M_elems[0]);
  (pvVar10->max_corner)._data._M_elems[2] = ghost.max_corner._data._M_elems[2];
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}